

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  byte bVar1;
  byte bVar2;
  Schema *pSVar3;
  Schema *pSVar4;
  Trigger *pTVar5;
  Trigger *pTVar6;
  HashElem *pHVar7;
  long lVar8;
  
  if (pParse->disableTriggers != '\0') {
    return (Trigger *)0x0;
  }
  pSVar3 = pParse->db->aDb[1].pSchema;
  pSVar4 = pTab->pSchema;
  if ((pSVar3 == pSVar4) || (pHVar7 = (pSVar3->trigHash).first, pHVar7 == (HashElem *)0x0)) {
    pTVar6 = (Trigger *)0x0;
LAB_0019ff24:
    if (pTVar6 == (Trigger *)0x0) {
      return pTab->pTrigger;
    }
    return pTVar6;
  }
  pTVar6 = (Trigger *)0x0;
LAB_0019fec5:
  pTVar5 = (Trigger *)pHVar7->data;
  if (pTVar5->pTabSchema == pSVar4) {
    lVar8 = 0;
    do {
      bVar1 = pTVar5->table[lVar8];
      bVar2 = pTab->zName[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_0019fefe;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_0019fefe;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_0019ff15;
LAB_0019fefe:
  if (bVar1 == bVar2) {
    if (pTVar6 == (Trigger *)0x0) {
      pTVar6 = pTab->pTrigger;
    }
    pTVar5->pNext = pTVar6;
    pTVar6 = pTVar5;
  }
LAB_0019ff15:
  pHVar7 = pHVar7->next;
  if (pHVar7 == (HashElem *)0x0) goto LAB_0019ff24;
  goto LAB_0019fec5;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema * const pTmpSchema = pParse->db->aDb[1].pSchema;
  Trigger *pList = 0;                  /* List of triggers to return */

  if( pParse->disableTriggers ){
    return 0;
  }

  if( pTmpSchema!=pTab->pSchema ){
    HashElem *p;
    assert( sqlite3SchemaMutexHeld(pParse->db, 0, pTmpSchema) );
    for(p=sqliteHashFirst(&pTmpSchema->trigHash); p; p=sqliteHashNext(p)){
      Trigger *pTrig = (Trigger *)sqliteHashData(p);
      if( pTrig->pTabSchema==pTab->pSchema
       && 0==sqlite3StrICmp(pTrig->table, pTab->zName) 
      ){
        pTrig->pNext = (pList ? pList : pTab->pTrigger);
        pList = pTrig;
      }
    }
  }

  return (pList ? pList : pTab->pTrigger);
}